

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week7-app3.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  _Rb_tree_color _Var1;
  _Rb_tree_color *p_Var2;
  _Base_ptr p_Var3;
  mapped_type *pmVar4;
  ostream *poVar5;
  long lVar6;
  initializer_list<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<int> __l_01;
  initializer_list<Gender> __l_02;
  allocator_type local_179;
  array<float,_3UL> a;
  vector<Gender,_std::allocator<Gender>_> vg;
  vector<int,_std::allocator<int>_> v;
  vector<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vp;
  undefined8 local_114;
  undefined4 local_10c;
  undefined1 local_108 [8];
  _Alloc_hider _Stack_100;
  _Base_ptr local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  undefined1 local_e0 [40];
  undefined1 local_b8 [48];
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m1;
  KeyValue p;
  
  p.first = 10;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&p.second,"ten",(allocator<char> *)local_108);
  local_108._0_4_ = 10;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&_Stack_100,"ten",(allocator<char> *)&m1);
  local_e0._0_4_ = 0xb;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_e0 + 8),"eleven",(allocator<char> *)&v);
  local_b8._0_4_ = 0xc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_b8 + 8),"twelve",(allocator<char> *)&vg);
  __l._M_len = 3;
  __l._M_array = (iterator)local_108;
  std::
  vector<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&vp,__l,(allocator_type *)&a);
  lVar6 = 0x58;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar6));
    lVar6 = lVar6 + -0x28;
  } while (lVar6 != -0x20);
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start._0_4_ =
       10;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[4],_true>
            ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_108,(int *)&v,(char (*) [4])"ten");
  vg.super__Vector_base<Gender,_std::allocator<Gender>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(vg.super__Vector_base<Gender,_std::allocator<Gender>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,0xb);
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[7],_true>
            ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_e0,(int *)&vg,(char (*) [7])"eleven");
  a._M_elems[0] = 1.68156e-44;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[7],_true>
            ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_b8,(int *)&a,(char (*) [7])"twelve");
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_108;
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&m1,__l_00,(less<int> *)&local_114,&local_179);
  lVar6 = 0x58;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar6));
    lVar6 = lVar6 + -0x28;
  } while (lVar6 != -0x20);
  local_108 = (undefined1  [8])0x0;
  _Stack_100._M_p = (pointer)0x0;
  local_f8 = (_Base_ptr)0x0;
  local_e0._0_8_ = 0;
  local_f0._M_allocated_capacity = (size_type)(string *)&_Stack_100;
  local_f0._8_8_ = (string *)&_Stack_100;
  for (p_Var3 = m1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &m1._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    _Var1 = p_Var3[1]._M_color;
    p_Var2 = (_Rb_tree_color *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)local_108,(key_type *)&p_Var3[1]._M_parent);
    *p_Var2 = _Var1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&v,"twelve",(allocator<char> *)&vg);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)local_108,(key_type *)&v);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pmVar4);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string((string *)&v);
  vg.super__Vector_base<Gender,_std::allocator<Gender>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x200000001;
  vg.super__Vector_base<Gender,_std::allocator<Gender>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 3;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&vg;
  std::vector<int,_std::allocator<int>_>::vector(&v,__l_01,(allocator_type *)&a);
  vg.super__Vector_base<Gender,_std::allocator<Gender>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(vg.super__Vector_base<Gender,_std::allocator<Gender>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,4);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&v,(int *)&vg);
  a._M_elems[0] = 10.0;
  a._M_elems[1] = 20.0;
  a._M_elems[2] = 30.0;
  local_114 = 1;
  local_10c = 0;
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&local_114;
  std::vector<Gender,_std::allocator<Gender>_>::vector(&vg,__l_02,(allocator_type *)&local_179);
  print_container<std::vector<int,_std::allocator<int>_>_>(&v);
  print_container<std::array<float,_3UL>_>(&a);
  print_container<std::vector<Gender,_std::allocator<Gender>_>_>(&vg);
  print_container(&vp);
  std::_Vector_base<Gender,_std::allocator<Gender>_>::~_Vector_base
            (&vg.super__Vector_base<Gender,_std::allocator<Gender>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)local_108);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&m1._M_t);
  std::
  vector<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&vp);
  std::__cxx11::string::~string((string *)&p.second);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{

    auto p = KeyValue{10, "ten"};
    auto vp = vector<KeyValue>{
        {10, "ten"},
        {11, "eleven"},
        {12, "twelve"}
    };

    auto m1 = map<int, string>{
        {10, "ten"},
        {11, "eleven"},
        {12, "twelve"}
    };

    auto m2 = map<string, int>();
//    {
//        {"ten", 10},
//        {"eleven", 11},
//        {"twelve", 12}
//    };

//    for(auto iter=m1.begin(); iter!=m1.end(); ++iter)
//    {
//        const auto& item = *iter; // item is of type pair<int, string>
//        const auto& key = item.first;
//        const auto& value = item.second;
//        m2[value] = key;
//    }

//    for(auto iter=m1.begin(); iter!=m1.end(); ++iter)
//    {
//        const auto& [key, value] = *iter; // structured-binding
//        m2[value] = key;
//    }

    for(const auto& [key, value] : m1)
        m2[value] = key;

    cout << m2["twelve"] << endl;

    auto v = vector<int>{1, 2, 3};
    v.push_back(4);
    auto a = array<float, 3>{10.0f, 20.0f, 30.0f};
    auto vg = vector<Gender>{Male, Female, Female};
    print_container(v);
    print_container(a);
    print_container(vg);
    print_container(vp);

//    print_container(10);

    return 0;
}